

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O3

bool read_from_file(string *file,PFT_PROGRAM_DATA ftData)

{
  char cVar1;
  ostream *poVar2;
  ifstream input_file;
  CONFIG_DATA config;
  char acStack_2c8 [520];
  CONFIG_DATA local_c0;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading ",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(file->_M_dataplus)._M_p,file->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ifstream::ifstream(acStack_2c8,(string *)file,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open file ",0x14);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    std::istream::read(acStack_2c8,(long)&local_c0);
    config_to_ft(ftData,&local_c0);
    std::istream::read(acStack_2c8,0x159560);
    std::istream::read(acStack_2c8,0x159580);
    std::istream::read(acStack_2c8,0x159590);
    std::istream::read(acStack_2c8,0x1595d0);
    std::ifstream::close();
    ftData->Manufacturer = ManufacturerBuf;
    ftData->ManufacturerId = ManufacturerIdBuf;
    ftData->Description = DescriptionBuf;
    ftData->SerialNumber = SerialNumberBuf;
  }
  std::ifstream::~ifstream(acStack_2c8);
  return (bool)cVar1;
}

Assistant:

bool read_from_file(const string& file, PFT_PROGRAM_DATA ftData) {
    cout << "Reading " << file << endl;
    try {
        ifstream input_file(file, ios::in | ios::binary);
        if (!input_file.is_open()) {
            cerr << "Failed to open file " << file << endl;
            return false;
        }
        CONFIG_DATA config;

        input_file.read((char *) &config, sizeof(CONFIG_DATA));
        config_to_ft(ftData, &config);
        input_file.read(ManufacturerBuf, sizeof(ManufacturerBuf));
        input_file.read(ManufacturerIdBuf, sizeof(ManufacturerIdBuf));
        input_file.read(DescriptionBuf, sizeof(DescriptionBuf));
        input_file.read(SerialNumberBuf, sizeof(SerialNumberBuf));
        input_file.close();
        ftData->Manufacturer = ManufacturerBuf;
        ftData->ManufacturerId = ManufacturerIdBuf;
        ftData->Description = DescriptionBuf;
        ftData->SerialNumber = SerialNumberBuf;
    } catch (...) {
        cerr << "Failed to read file " << file << endl;
        return false;
    }
    return true;
}